

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall
tcu::Matrix<tcu::Interval,_2,_3>::Matrix
          (Matrix<tcu::Interval,_2,_3> *this,Matrix<tcu::Interval,_2,_3> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  undefined8 *puVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  undefined4 local_e;
  undefined3 uStack_a;
  undefined4 local_7;
  undefined3 uStack_3;
  
  lVar7 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -0x20) = 0;
    puVar3 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar7);
    *puVar3 = 0x7ff0000000000000;
    puVar3[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -8) = 0;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar7;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0xb0);
  lVar7 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -0x20) = 0;
    *(undefined4 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -0x1f) = local_7;
    *(uint *)((long)(this->m_data).m_data[0].m_data + lVar7 + -0x1c) =
         CONCAT31(uStack_3,local_7._3_1_);
    puVar3 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar7);
    *puVar3 = 0x7ff0000000000000;
    puVar3[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -8) = 0;
    *(undefined4 *)((long)(this->m_data).m_data[0].m_data + lVar7 + -7) = local_e;
    *(uint *)((long)(this->m_data).m_data[0].m_data + lVar7 + -4) = CONCAT31(uStack_a,local_e._3_1_)
    ;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar7;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0xb0);
  lVar7 = 0;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)&(this->m_data).m_data[0].m_data[lVar7].m_hi + lVar8) =
           *(undefined8 *)((long)&(src->m_data).m_data[0].m_data[lVar7].m_hi + lVar8);
      pbVar1 = &(src->m_data).m_data[0].m_data[lVar7].m_hasNaN + lVar8;
      dVar4 = *(double *)(pbVar1 + 8);
      pbVar2 = &(this->m_data).m_data[0].m_data[lVar7].m_hasNaN + lVar8;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar4;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x90);
    lVar7 = 1;
    bVar5 = false;
  } while (bVar6);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}